

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETestSuite.cpp
# Opt level: O1

bool __thiscall
CETestSuite::test_vect_<double>
          (CETestSuite *this,vector<double,_std::allocator<double>_> *value,
          vector<double,_std::allocator<double>_> *expected,double *tol,string *function,int *line)

{
  undefined8 *puVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  uint __len;
  double dVar13;
  bool isMatch;
  string __str;
  char local_151;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  string *local_130;
  uint *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  CETestSuite *local_a0;
  vector<double,_std::allocator<double>_> *local_98;
  vector<double,_std::allocator<double>_> *local_90;
  char *local_88 [2];
  char local_78 [16];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_151 = '\x01';
  if (*(long *)(value + 8) - *(long *)value == *(long *)(expected + 8) - *(long *)expected) {
    lVar5 = *(long *)value;
    local_130 = function;
    local_128 = (uint *)line;
    local_a0 = this;
    if (*(long *)(value + 8) != lVar5) {
      uVar10 = 0;
      local_98 = expected;
      local_90 = value;
      do {
        dVar2 = *(double *)(*(long *)expected + uVar10 * 8);
        dVar13 = ABS(*(double *)(lVar5 + uVar10 * 8) - dVar2);
        if (ABS(*tol * dVar2) < dVar13) {
          __len = 1;
          if (9 < uVar10) {
            uVar3 = 4;
            uVar12 = uVar10;
            do {
              __len = uVar3;
              uVar4 = (uint)uVar12;
              if (uVar4 < 100) {
                __len = __len - 2;
                goto LAB_001056fb;
              }
              if (uVar4 < 1000) {
                __len = __len - 1;
                goto LAB_001056fb;
              }
              if (uVar4 < 10000) goto LAB_001056fb;
              uVar12 = (uVar12 & 0xffffffff) / 10000;
              uVar3 = __len + 4;
            } while (99999 < uVar4);
            __len = __len + 1;
          }
LAB_001056fb:
          uStack_40 = 0;
          local_88[0] = local_78;
          local_48 = dVar13;
          std::__cxx11::string::_M_construct((ulong)local_88,(char)__len);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_88[0],__len,(uint)uVar10);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,0x107130);
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_b0 = *plVar8;
            lStack_a8 = plVar6[3];
            local_c0 = &local_b0;
          }
          else {
            local_b0 = *plVar8;
            local_c0 = (long *)*plVar6;
          }
          local_b8 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_58 = *plVar8;
            lStack_50 = plVar6[3];
            local_68 = &local_58;
          }
          else {
            local_58 = *plVar8;
            local_68 = (long *)*plVar6;
          }
          local_60 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_68);
          puVar9 = (ulong *)(plVar6 + 2);
          if ((ulong *)*plVar6 == puVar9) {
            local_f0 = *puVar9;
            lStack_e8 = plVar6[3];
            local_100 = &local_f0;
          }
          else {
            local_f0 = *puVar9;
            local_100 = (ulong *)*plVar6;
          }
          local_f8 = plVar6[1];
          *plVar6 = (long)puVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_120,vsnprintf,0x148,"%f",local_48);
          uVar12 = 0xf;
          if (local_100 != &local_f0) {
            uVar12 = local_f0;
          }
          if (uVar12 < local_120._M_string_length + local_f8) {
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              uVar11 = local_120.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar11 < local_120._M_string_length + local_f8) goto LAB_001058d9;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_100)
            ;
          }
          else {
LAB_001058d9:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_100,(ulong)local_120._M_dataplus._M_p);
          }
          local_150 = &local_140;
          puVar1 = puVar7 + 2;
          if ((undefined8 *)*puVar7 == puVar1) {
            local_140 = *puVar1;
            uStack_138 = puVar7[3];
          }
          else {
            local_140 = *puVar1;
            local_150 = (undefined8 *)*puVar7;
          }
          local_148 = puVar7[1];
          *puVar7 = puVar1;
          puVar7[1] = 0;
          *(undefined1 *)puVar1 = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_150);
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_d0 = *plVar8;
            lStack_c8 = plVar6[3];
            local_e0 = &local_d0;
          }
          else {
            local_d0 = *plVar8;
            local_e0 = (long *)*plVar6;
          }
          local_d8 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          printf("- Fnc: %s, ln %d\n",(local_130->_M_dataplus)._M_p,(ulong)*local_128);
          printf("  [ ] %s\n",local_e0);
          if (local_e0 != &local_d0) {
            operator_delete(local_e0);
          }
          if (local_150 != &local_140) {
            operator_delete(local_150);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p);
          }
          if (local_100 != &local_f0) {
            operator_delete(local_100);
          }
          if (local_68 != &local_58) {
            operator_delete(local_68);
          }
          if (local_c0 != &local_b0) {
            operator_delete(local_c0);
          }
          if (local_88[0] != local_78) {
            operator_delete(local_88[0]);
          }
          local_151 = '\0';
          expected = local_98;
          value = local_90;
        }
        uVar10 = uVar10 + 1;
        lVar5 = *(long *)value;
      } while (uVar10 < (ulong)(*(long *)(value + 8) - lVar5 >> 3));
    }
    this = local_a0;
    if (local_151 == '\0') goto LAB_00105b71;
    local_e0 = &local_d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"VECTOR values and lengths ARE equal.","");
    printf("- Fnc: %s, ln %d\n",(local_130->_M_dataplus)._M_p,(ulong)*local_128);
    printf("  [x] %s\n",local_e0);
    if (local_e0 == &local_d0) goto LAB_00105b71;
  }
  else {
    local_e0 = &local_d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"VECTOR lengths are NOT equal.","");
    printf("- Fnc: %s, ln %d\n",(function->_M_dataplus)._M_p,(ulong)(uint)*line);
    printf("  [ ] %s\n",local_e0);
    if (local_e0 == &local_d0) goto LAB_00105b71;
  }
  operator_delete(local_e0);
LAB_00105b71:
  (*this->_vptr_CETestSuite[0xf])(this,&local_151);
  return (bool)local_151;
}

Assistant:

bool CETestSuite::test_vect_(const std::vector<T>& value,
                             const std::vector<T>& expected,
                             const T&           tol,
                             const std::string& function,
                             const int&         line)
{
    bool isMatch = true;
    if (value.size() == expected.size()) {
        for (int i=0; i<value.size(); i++) {
            T rel_tol = std::fabs(expected[i] * tol);
            T diff    = std::fabs(value[i] - expected[i]);
            if (diff > rel_tol) {
                log_failure("VECTOR values at index "+std::to_string(i)+" " +
                            "are NOT equal (difference = " + 
                            std::to_string(diff) + ")", function, line);
                isMatch = false;
            }
        }

        // If there is a match, then we consider the vectors to be equal
        if (isMatch) {
            log_success("VECTOR values and lengths ARE equal.", function, line);
        }
    } else {
        log_failure("VECTOR lengths are NOT equal.", function, line);
    }

    update_pass(isMatch);
    return isMatch;
}